

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_clib___newindex(lua_State *L)

{
  TValue *pTVar1;
  CTState *cts_00;
  TValue *pTVar2;
  uint local_9c;
  CType *pCStack_98;
  CTInfo qual;
  CType *d;
  GCcdata *cd;
  CTState *cts;
  TValue *o;
  TValue *tv;
  lua_State *L_local;
  CTState *cts_1;
  
  pTVar2 = ffi_clib_index(L);
  pTVar1 = L->base;
  if ((pTVar1 + 2 < L->top) && ((int)(pTVar2->field_4).it >> 0xf == -0xb)) {
    cts_00 = *(CTState **)((L->glref).ptr64 + 0x180);
    cts_00->L = L;
    pCStack_98 = cts_00->tab + *(ushort *)((pTVar2->u64 & 0x7fffffffffff) + 10);
    if (pCStack_98->info >> 0x1c == 0xc) {
      local_9c = 0;
      while (pCStack_98 = cts_00->tab + (pCStack_98->info & 0xffff), pCStack_98->info >> 0x1c == 8)
      {
        if ((pCStack_98->info >> 0x10 & 0xff) == 1) {
          local_9c = pCStack_98->size | local_9c;
        }
      }
      if (((pCStack_98->info | local_9c) & 0x2000000) == 0) {
        lj_cconv_ct_tv(cts_00,pCStack_98,*(uint8_t **)((pTVar2->u64 & 0x7fffffffffff) + 0x10),
                       pTVar1 + 2,0);
        return 0;
      }
    }
  }
  lj_err_caller(L,LJ_ERR_FFI_WRCONST);
}

Assistant:

LJLIB_CF(ffi_clib___newindex)	LJLIB_REC(clib_index 0)
{
  TValue *tv = ffi_clib_index(L);
  TValue *o = L->base+2;
  if (o < L->top && tviscdata(tv)) {
    CTState *cts = ctype_cts(L);
    GCcdata *cd = cdataV(tv);
    CType *d = ctype_get(cts, cd->ctypeid);
    if (ctype_isextern(d->info)) {
      CTInfo qual = 0;
      for (;;) {  /* Skip attributes and collect qualifiers. */
	d = ctype_child(cts, d);
	if (!ctype_isattrib(d->info)) break;
	if (ctype_attrib(d->info) == CTA_QUAL) qual |= d->size;
      }
      if (!((d->info|qual) & CTF_CONST)) {
	lj_cconv_ct_tv(cts, d, *(void **)cdataptr(cd), o, 0);
	return 0;
      }
    }
  }
  lj_err_caller(L, LJ_ERR_FFI_WRCONST);
  return 0;  /* unreachable */
}